

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  undefined8 *puVar5;
  long *plVar6;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *pcVar12;
  ostream *poVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  int pipe_fd [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  long local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined8 local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  undefined8 local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int local_60;
  int local_5c;
  string local_58;
  int local_34;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_100,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/googletest/src/googletest_project/googletest/src/gtest-death-test.cc"
                       ,0x41a);
    Message::Message((Message *)&local_120);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120.ptr_ + 0x10),
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120.ptr_ + 0x10)," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120.ptr_ + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_120.ptr_ + 0x10)," ",1);
    poVar13 = (ostream *)(local_120.ptr_ + 0x10);
    if (sVar3 == 0) {
      lVar10 = 0x26;
      pcVar12 = "couldn\'t detect the number of threads.";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_120.ptr_ + 0x10));
      poVar13 = (ostream *)(local_120.ptr_ + 0x10);
      lVar10 = 9;
      pcVar12 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,lVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120.ptr_ + 0x10),
               " See https://github.com/google/googletest/blob/master/googletest/docs/advanced.md#death-tests-and-threads"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120.ptr_ + 0x10),
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120.ptr_ + 0x10),
               " this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_e0,local_120.ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.ptr_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_120.ptr_ + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_100);
  }
  iVar1 = pipe(&local_60);
  if (iVar1 == -1) {
    paVar16 = &local_70;
    local_80 = paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
    paVar17 = &local_b0;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar5;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if (local_c0 == paVar15) {
      local_b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_b0._8_8_ = puVar5[3];
      local_c0 = paVar17;
    }
    else {
      local_b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_b8 = puVar5[1];
    *puVar5 = paVar15;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    paVar15 = &local_130;
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if (local_140 == paVar8) {
      local_130._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_130._8_8_ = puVar5[3];
      local_140 = paVar15;
    }
    else {
      local_130._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_138 = puVar5[1];
    *puVar5 = paVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_58._M_dataplus._M_p._0_4_ = 0x41e;
    StreamableToString<int>(&local_a0,(int *)&local_58);
    uVar14 = 0xf;
    if (local_140 != paVar15) {
      uVar14 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_a0._M_string_length + local_138) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar14 = local_a0.field_2._M_allocated_capacity;
      }
      paVar8 = local_140;
      if (local_a0._M_string_length + local_138 <= (ulong)uVar14) goto LAB_0013b183;
    }
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
LAB_0013b194:
    local_100 = (long *)*puVar5;
    plVar6 = puVar5 + 2;
    if (local_100 == plVar6) {
      local_f0 = *plVar6;
      lStack_e8 = puVar5[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar6;
    }
    local_f8 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    paVar8 = &local_110;
    local_120.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.ptr_ == paVar11) {
      local_110._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_110._8_8_ = puVar5[3];
      local_120.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar8;
    }
    else {
      local_110._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_118 = puVar5[1];
    *puVar5 = paVar11;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    paVar11 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)*puVar5;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar9) {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_e0.field_2._8_8_ = puVar5[3];
      local_e0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_e0._M_string_length = puVar5[1];
    *puVar5 = paVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    DeathTestAbort(&local_e0);
    puVar5 = extraout_RAX_00;
    local_e0._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    paVar16 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar16) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var2;
      if (_Var2 == 0) {
        do {
          iVar1 = close(local_60);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_5c;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if (local_80 == paVar17) {
          local_70._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_70._8_8_ = puVar5[3];
          local_80 = &local_70;
        }
        else {
          local_70._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_78 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if (local_c0 == paVar17) {
          local_b0._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_b0._8_8_ = puVar5[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_b8 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        local_34 = 0x42f;
        StreamableToString<int>(&local_58,&local_34);
        uVar14 = 0xf;
        if (local_c0 != &local_b0) {
          uVar14 = local_b0._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_58._M_string_length + local_b8) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
              &local_58.field_2) {
            uVar14 = local_58.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_58._M_string_length + local_b8) goto LAB_0013ac6b;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_c0);
        }
        else {
LAB_0013ac6b:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_c0,
                              (ulong)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                              local_58._M_dataplus._M_p._0_4_));
        }
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if (local_140 == paVar17) {
          local_130._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_130._8_8_ = puVar5[3];
          local_140 = &local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_138 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        paVar17->_M_local_buf[0] = '\0';
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
        local_100 = (long *)*puVar5;
        plVar6 = puVar5 + 2;
        if (local_100 == plVar6) {
          local_f0 = *plVar6;
          lStack_e8 = puVar5[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar6;
        }
        local_f8 = puVar5[1];
        *puVar5 = plVar6;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        local_120.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.ptr_ == paVar17) {
          local_110._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_110._8_8_ = puVar5[3];
          local_120.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110
          ;
        }
        else {
          local_110._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_118 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_e0._M_dataplus._M_p = (pointer)*puVar5;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar8) goto LAB_0013b155;
        local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_e0.field_2._8_8_ = puVar5[3];
        local_e0._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        do {
          iVar1 = close(local_5c);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_60;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if (local_80 == paVar17) {
          local_70._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_70._8_8_ = puVar5[3];
          local_80 = &local_70;
        }
        else {
          local_70._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_78 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if (local_c0 == paVar17) {
          local_b0._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_b0._8_8_ = puVar5[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_b8 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        local_34 = 0x43b;
        StreamableToString<int>(&local_58,&local_34);
        uVar14 = 0xf;
        if (local_c0 != &local_b0) {
          uVar14 = local_b0._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_58._M_string_length + local_b8) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
              &local_58.field_2) {
            uVar14 = local_58.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_58._M_string_length + local_b8) goto LAB_0013aae4;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_c0);
        }
        else {
LAB_0013aae4:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_c0,
                              (ulong)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                              local_58._M_dataplus._M_p._0_4_));
        }
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if (local_140 == paVar17) {
          local_130._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_130._8_8_ = puVar5[3];
          local_140 = &local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_138 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        paVar17->_M_local_buf[0] = '\0';
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_100 = (long *)*plVar6;
        plVar7 = plVar6 + 2;
        if (local_100 == plVar7) {
          local_f0 = *plVar7;
          lStack_e8 = plVar6[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar7;
        }
        local_f8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        local_120.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.ptr_ == paVar17) {
          local_110._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_110._8_8_ = puVar5[3];
          local_120.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110
          ;
        }
        else {
          local_110._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_118 = puVar5[1];
        *puVar5 = paVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_e0._M_dataplus._M_p = (pointer)*puVar5;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p == paVar8) {
          local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_e0.field_2._8_8_ = puVar5[3];
          local_e0._M_dataplus._M_p = (pointer)paVar16;
        }
        else {
          local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_e0._M_string_length = puVar5[1];
        *puVar5 = paVar8;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        DeathTestAbort(&local_e0);
        puVar5 = extraout_RAX;
        local_e0._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_0013b155:
        local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      paVar17 = &local_a0.field_2;
      paVar15 = &local_70;
      local_e0._M_string_length = puVar5[1];
      *puVar5 = paVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      DeathTestAbort(&local_e0);
LAB_0013b183:
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)paVar8);
      goto LAB_0013b194;
    }
    paVar17 = &local_70;
    local_80 = paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
    paVar15 = &local_b0;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar5;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if (local_c0 == paVar8) {
      local_b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_b0._8_8_ = puVar5[3];
      local_c0 = paVar15;
    }
    else {
      local_b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_b8 = puVar5[1];
    *puVar5 = paVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    paVar8 = &local_130;
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if (local_140 == paVar11) {
      local_130._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_130._8_8_ = puVar5[3];
      local_140 = paVar8;
    }
    else {
      local_130._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_138 = puVar5[1];
    *puVar5 = paVar11;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_58._M_dataplus._M_p._0_4_ = 0x42c;
    StreamableToString<int>(&local_a0,(int *)&local_58);
    uVar14 = 0xf;
    if (local_140 != paVar8) {
      uVar14 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_a0._M_string_length + local_138) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar14 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_a0._M_string_length + local_138) goto LAB_0013b0c6;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_140);
    }
    else {
LAB_0013b0c6:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
    }
    local_100 = (long *)*puVar5;
    plVar6 = puVar5 + 2;
    if (local_100 == plVar6) {
      local_f0 = *plVar6;
      lStack_e8 = puVar5[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar6;
    }
    local_f8 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    paVar11 = &local_110;
    local_120.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.ptr_ == paVar9) {
      local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_110._8_8_ = puVar5[3];
      local_120.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar11;
    }
    else {
      local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_118 = puVar5[1];
    *puVar5 = paVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    local_e0._M_dataplus._M_p = (pointer)*puVar5;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar9) {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_e0.field_2._8_8_ = puVar5[3];
      local_e0._M_dataplus._M_p = (pointer)paVar16;
      goto LAB_0013b382;
    }
  }
  local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
LAB_0013b382:
  local_e0._M_string_length = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar16) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.ptr_ != paVar11) {
    operator_delete(local_120.ptr_,local_110._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != paVar8) {
    operator_delete(local_140,local_130._M_allocated_capacity + 1);
  }
  if (local_c0 != paVar15) {
    operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (local_80 != paVar17) {
    operator_delete(local_80,local_70._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}